

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

sysbvm_tuple_t sysbvm_arrayOrByteArray_at(sysbvm_tuple_t array,size_t index)

{
  sysbvm_tuple_t sVar1;
  
  if ((array & 0xf) == 0 && array != 0) {
    if ((*(uint *)(array + 8) & 0x300) == 0x200) {
      if (*(uint *)(array + 0xc) <= index) {
        sysbvm_error_indexOutOfBounds();
      }
      sVar1 = (ulong)*(byte *)(array + 0x10 + index) << 4 | 3;
    }
    else {
      if (*(uint *)(array + 0xc) >> 3 <= index) {
        sysbvm_error_indexOutOfBounds();
      }
      sVar1 = *(sysbvm_tuple_t *)(array + 0x10 + index * 8);
    }
  }
  else {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_arrayOrByteArray_at(sysbvm_tuple_t array, size_t index)
{
    if(!sysbvm_tuple_isNonNullPointer(array)) return SYSBVM_NULL_TUPLE;

    if(sysbvm_tuple_isBytes(array))
    {
        size_t size = sysbvm_tuple_getSizeInBytes(array);
        if(index >= size) sysbvm_error_indexOutOfBounds();
        return sysbvm_tuple_uint8_encode(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(array)->bytes[index]);
    }
    else
    {
        size_t size = sysbvm_tuple_getSizeInSlots(array);
        if(index >= size) sysbvm_error_indexOutOfBounds();
        return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(array)->pointers[index];
    }
}